

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_generators.hpp
# Opt level: O3

bool __thiscall Catch::Generators::Generators<signed_char>::next(Generators<signed_char> *this)

{
  pointer pGVar1;
  bool bVar2;
  ulong uVar3;
  
  pGVar1 = (this->m_generators).
           super__Vector_base<Catch::Generators::GeneratorWrapper<signed_char>,_std::allocator<Catch::Generators::GeneratorWrapper<signed_char>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (this->m_current <
      (ulong)((long)(this->m_generators).
                    super__Vector_base<Catch::Generators::GeneratorWrapper<signed_char>,_std::allocator<Catch::Generators::GeneratorWrapper<signed_char>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pGVar1 >> 3)) {
    bVar2 = GeneratorWrapper<signed_char>::next(pGVar1 + this->m_current);
    uVar3 = this->m_current;
    if (!bVar2) {
      uVar3 = uVar3 + 1;
      this->m_current = uVar3;
    }
    return uVar3 < (ulong)((long)(this->m_generators).
                                 super__Vector_base<Catch::Generators::GeneratorWrapper<signed_char>,_std::allocator<Catch::Generators::GeneratorWrapper<signed_char>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->m_generators).
                                 super__Vector_base<Catch::Generators::GeneratorWrapper<signed_char>,_std::allocator<Catch::Generators::GeneratorWrapper<signed_char>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3);
  }
  return false;
}

Assistant:

bool next() override {
            if (m_current >= m_generators.size()) {
                return false;
            }
            const bool current_status = m_generators[m_current].next();
            if (!current_status) {
                ++m_current;
            }
            return m_current < m_generators.size();
        }